

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O2

void __thiscall WriteIncludesBase::acceptAction(WriteIncludesBase *this,DomAction *node)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (Data *)0x0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_40.ptr = L"QAction";
  local_58.size = 0;
  local_40.size = 7;
  add(this,(QString *)&local_40,(DomCustomWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  TreeWalker::acceptAction(&this->super_TreeWalker,node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptAction(DomAction *node)
{
    add(QStringLiteral("QAction"));
    TreeWalker::acceptAction(node);
}